

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O0

Vec_Wrd_t * Bdc_SpfdReadFiles6(Vec_Int_t **pvWeights)

{
  int iVar1;
  Vec_Wrd_t *p;
  FILE *pFVar2;
  word *__ptr;
  Vec_Int_t *p_00;
  int *__ptr_00;
  int RetValue;
  FILE *pFile;
  Vec_Wrd_t *vDivs;
  Vec_Int_t *vWeights;
  Vec_Int_t **pvWeights_local;
  
  p = Vec_WrdStart(0xc2f537);
  pFVar2 = fopen("func6v6n_bin.txt","rb");
  __ptr = Vec_WrdArray(p);
  iVar1 = Vec_WrdSize(p);
  fread(__ptr,8,(long)iVar1,pFVar2);
  fclose(pFVar2);
  p_00 = Vec_IntStart(0xc2f537);
  pFVar2 = fopen("func6v6nW_bin.txt","rb");
  __ptr_00 = Vec_IntArray(p_00);
  iVar1 = Vec_IntSize(p_00);
  fread(__ptr_00,4,(long)iVar1,pFVar2);
  fclose(pFVar2);
  *pvWeights = p_00;
  return p;
}

Assistant:

Vec_Wrd_t * Bdc_SpfdReadFiles6( Vec_Int_t ** pvWeights )
{
    Vec_Int_t * vWeights;
    Vec_Wrd_t * vDivs = Vec_WrdStart( 12776759 );
    FILE * pFile = fopen( "func6v6n_bin.txt", "rb" );
    int RetValue;
    RetValue = fread( Vec_WrdArray(vDivs), sizeof(word), Vec_WrdSize(vDivs), pFile );
    fclose( pFile );

    vWeights = Vec_IntStart( 12776759 );
    pFile = fopen( "func6v6nW_bin.txt", "rb" );
    RetValue = fread( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
    fclose( pFile );

    *pvWeights = vWeights;
    return vDivs;
}